

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O0

void privop_pasv_listen(session_t *sess)

{
  uint16_t uVar1;
  int iVar2;
  socklen_t local_3c;
  undefined1 local_38 [2];
  unsigned_short port;
  socklen_t sa_in_len;
  sockaddr_in sa_in;
  char local_ip [16];
  session_t *sess_local;
  
  memset(sa_in.sin_zero,0,0x10);
  getlocalip((char *)sa_in.sin_zero);
  iVar2 = tcp_server((char *)sa_in.sin_zero,0);
  sess->pasv_listen_fd = iVar2;
  local_3c = 0x10;
  iVar2 = getsockname(sess->pasv_listen_fd,(sockaddr *)local_38,&local_3c);
  if (iVar2 < 0) {
    perror("getsockname");
    exit(1);
  }
  uVar1 = ntohs(port);
  priv_sock_send_int(sess->parent_fd,(uint)uVar1);
  return;
}

Assistant:

void privop_pasv_listen(session_t *sess) {
  char local_ip[16] = {0};
  getlocalip(local_ip);

  sess->pasv_listen_fd = tcp_server(local_ip, 0);
  struct sockaddr_in sa_in;
  socklen_t sa_in_len = sizeof(sa_in);
  if (getsockname(sess->pasv_listen_fd, (struct sockaddr *) &sa_in, &sa_in_len) < 0) {
    ERR_EXIT("getsockname");
  }

  unsigned short port = ntohs(sa_in.sin_port);

  priv_sock_send_int(sess->parent_fd, (int) port);
}